

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qapplication.cpp
# Opt level: O0

QWidget * QApplicationPrivate::focusNextPrevChild_helper
                    (QWidget *toplevel,bool next,bool *wrappingOccurred)

{
  long lVar1;
  byte bVar2;
  bool bVar3;
  bool bVar4;
  FocusPolicy FVar5;
  FocusPolicy FVar6;
  WindowType WVar7;
  QWidget *pQVar8;
  byte *in_RDX;
  byte in_SIL;
  QWidget *in_RDI;
  long in_FS_OFFSET;
  byte bVar9;
  bool composites;
  bool canTakeFocus;
  QWidget *focusProxy;
  bool focusWidgetAfterWindow;
  bool seenWindow;
  QWidget *test;
  QWidget *w;
  QWidget *f;
  uint focus_flag;
  anon_class_1_0_00000001 effectiveFocusPolicy;
  QWidget *in_stack_ffffffffffffff78;
  QWidget *in_stack_ffffffffffffff80;
  undefined5 in_stack_ffffffffffffff88;
  undefined1 in_stack_ffffffffffffff8d;
  undefined1 in_stack_ffffffffffffff8e;
  undefined1 in_stack_ffffffffffffff8f;
  QWidget *in_stack_ffffffffffffff90;
  undefined5 in_stack_ffffffffffffff98;
  undefined1 uVar10;
  byte local_52;
  QWidget *local_50;
  QWidget *local_48;
  QWidget *local_40;
  QWidget *in_stack_ffffffffffffffe8;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  bVar2 = in_SIL & 1;
  bVar3 = qt_tab_all_widgets();
  FVar5 = StrongFocus;
  if (bVar3) {
    FVar5 = TabFocus;
  }
  local_40 = QWidget::focusWidget((QWidget *)0x2ce1d4);
  if (local_40 == (QWidget *)0x0) {
    local_40 = in_RDI;
  }
  local_48 = local_40;
  local_50 = QWidget::nextInFocusChain(in_stack_ffffffffffffff80);
  bVar3 = false;
  local_52 = 0;
  while (uVar10 = local_50 != (QWidget *)0x0 && local_50 != local_40,
        local_50 != (QWidget *)0x0 && local_50 != local_40) {
    bVar4 = QWidget::isWindow(in_stack_ffffffffffffff80);
    if (bVar4) {
      bVar3 = true;
    }
    QWidget::d_func((QWidget *)0x2ce259);
    pQVar8 = QWidgetPrivate::deepestFocusProxy
                       ((QWidgetPrivate *)
                        CONCAT17(in_stack_ffffffffffffff8f,
                                 CONCAT16(in_stack_ffffffffffffff8e,
                                          CONCAT15(in_stack_ffffffffffffff8d,
                                                   in_stack_ffffffffffffff88))));
    in_stack_ffffffffffffff90 = local_50;
    if (pQVar8 != (QWidget *)0x0) {
      in_stack_ffffffffffffff90 = pQVar8;
    }
    FVar6 = focusNextPrevChild_helper::anon_class_1_0_00000001::operator()
                      ((anon_class_1_0_00000001 *)in_stack_ffffffffffffff80,
                       in_stack_ffffffffffffff78);
    bVar9 = (FVar6 & FVar5) == FVar5;
    if (pQVar8 == (QWidget *)0x0) {
      in_stack_ffffffffffffff8e = false;
    }
    else if (bVar2 == 0) {
      in_stack_ffffffffffffff8e =
           QWidget::isAncestorOf
                     ((QWidget *)
                      CONCAT17(in_stack_ffffffffffffff8f,
                               CONCAT16(in_stack_ffffffffffffff8e,
                                        CONCAT15(in_stack_ffffffffffffff8d,in_stack_ffffffffffffff88
                                                ))),in_stack_ffffffffffffff80);
      in_stack_ffffffffffffff8f = in_stack_ffffffffffffff8e;
    }
    else {
      in_stack_ffffffffffffff8e =
           QWidget::isAncestorOf
                     ((QWidget *)
                      CONCAT17(in_stack_ffffffffffffff8f,
                               CONCAT16(in_stack_ffffffffffffff8e,
                                        CONCAT15(in_stack_ffffffffffffff8d,in_stack_ffffffffffffff88
                                                ))),in_stack_ffffffffffffff80);
      in_stack_ffffffffffffff8f = in_stack_ffffffffffffff8e;
    }
    if (((((((bVar9 & 1) != 0) && ((bool)in_stack_ffffffffffffff8e == false)) &&
          (bVar4 = QWidget::isVisibleTo
                             ((QWidget *)
                              CONCAT17(bVar9,(uint7)CONCAT15(uVar10,in_stack_ffffffffffffff98)),
                              in_stack_ffffffffffffff90), bVar4)) &&
         ((bVar4 = QWidget::isEnabled((QWidget *)0x2ce339), bVar4 &&
          ((WVar7 = QWidget::windowType(in_stack_ffffffffffffff80), WVar7 != SubWindow ||
           (bVar4 = QWidget::isAncestorOf
                              ((QWidget *)
                               CONCAT17(in_stack_ffffffffffffff8f,
                                        CONCAT16(in_stack_ffffffffffffff8e,
                                                 CONCAT15(in_stack_ffffffffffffff8d,
                                                          in_stack_ffffffffffffff88))),
                               in_stack_ffffffffffffff80), bVar4)))))) &&
        ((WVar7 = QWidget::windowType(in_stack_ffffffffffffff80), WVar7 != SubWindow ||
         (bVar4 = QWidget::isAncestorOf
                            ((QWidget *)
                             CONCAT17(in_stack_ffffffffffffff8f,
                                      CONCAT16(in_stack_ffffffffffffff8e,
                                               CONCAT15(in_stack_ffffffffffffff8d,
                                                        in_stack_ffffffffffffff88))),
                             in_stack_ffffffffffffff80), bVar4)))) && (local_40 != pQVar8)) {
      local_48 = local_50;
      if (bVar3) {
        local_52 = 1;
      }
      if (bVar2 != 0) break;
    }
    local_50 = QWidget::nextInFocusChain(in_stack_ffffffffffffff80);
  }
  if (in_RDX != (byte *)0x0) {
    if (bVar2 == 0) {
      local_52 = local_52 ^ 0xff;
    }
    *in_RDX = local_52 & 1;
  }
  if (local_48 == local_40) {
    if ((qt_in_tab_key_event & 1U) != 0) {
      QWidget::window(in_stack_ffffffffffffff90);
      QWidget::setAttribute
                (in_stack_ffffffffffffffe8,(WidgetAttribute)((ulong)in_RDI >> 0x20),
                 SUB81((ulong)in_RDI >> 0x18,0));
      QWidget::update(in_stack_ffffffffffffff78);
    }
    local_48 = (QWidget *)0x0;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return local_48;
  }
  __stack_chk_fail();
}

Assistant:

QWidget *QApplicationPrivate::focusNextPrevChild_helper(QWidget *toplevel, bool next,
                                                        bool *wrappingOccurred)
{
    uint focus_flag = qt_tab_all_widgets() ? Qt::TabFocus : Qt::StrongFocus;

    QWidget *f = toplevel->focusWidget();
    if (!f)
        f = toplevel;

    QWidget *w = f;
    QWidget *test = f->nextInFocusChain();
    bool seenWindow = false;
    bool focusWidgetAfterWindow = false;
    while (test && test != f) {
        if (test->isWindow())
            seenWindow = true;

        // If the next focus widget has a focus proxy, we need to check to ensure
        // that the proxy is in the correct parent-child direction (according to
        // \a next). This is to ensure that we can tab in and out of compound widgets
        // without getting stuck in a tab-loop between parent and child.
        QWidget *focusProxy = test->d_func()->deepestFocusProxy();
        auto effectiveFocusPolicy = [](QWidget *widget) {
            return widget->isEnabled() ? widget->focusPolicy() : Qt::NoFocus;
        };
        const bool canTakeFocus = (effectiveFocusPolicy(focusProxy ? focusProxy : test)
                                  & focus_flag) == focus_flag;
        const bool composites = focusProxy ? (next ? focusProxy->isAncestorOf(test)
                                                   : test->isAncestorOf(focusProxy))
                                           : false;
        if (canTakeFocus && !composites
            && test->isVisibleTo(toplevel) && test->isEnabled()
            && !(w->windowType() == Qt::SubWindow && !w->isAncestorOf(test))
            && (toplevel->windowType() != Qt::SubWindow || toplevel->isAncestorOf(test))
            && f != focusProxy) {
            w = test;
            if (seenWindow)
                focusWidgetAfterWindow = true;
            if (next)
                break;
        }
        test = test->nextInFocusChain();
    }

    if (wrappingOccurred != nullptr)
        *wrappingOccurred = next ? focusWidgetAfterWindow : !focusWidgetAfterWindow;

    if (w == f) {
        if (qt_in_tab_key_event) {
            w->window()->setAttribute(Qt::WA_KeyboardFocusChange);
            w->update();
        }
        return nullptr;
    }
    return w;
}